

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

void smtp_get_message(char *buffer,char **outptr)

{
  size_t sVar1;
  char *__s;
  
  for (__s = buffer + 4; (*__s == ' ' || (*__s == '\t')); __s = __s + 1) {
  }
  sVar1 = strlen(__s);
  do {
    if (sVar1 == 0) {
LAB_004dbd65:
      *outptr = __s;
      return;
    }
    if ((0x20 < (ulong)(byte)__s[sVar1 - 1]) ||
       ((0x100002600U >> ((ulong)(byte)__s[sVar1 - 1] & 0x3f) & 1) == 0)) {
      __s[sVar1] = '\0';
      goto LAB_004dbd65;
    }
    sVar1 = sVar1 - 1;
  } while( true );
}

Assistant:

static void smtp_get_message(char *buffer, char** outptr)
{
  size_t len = 0;
  char* message = NULL;

  /* Find the start of the message */
  for(message = buffer + 4; *message == ' ' || *message == '\t'; message++)
    ;

  /* Find the end of the message */
  for(len = strlen(message); len--;)
    if(message[len] != '\r' && message[len] != '\n' && message[len] != ' ' &&
        message[len] != '\t')
      break;

  /* Terminate the message */
  if(++len) {
    message[len] = '\0';
  }

  *outptr = message;
}